

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall sptk::Matrix::Resize(Matrix *this,int num_row,int num_column)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  if (num_row < 1) {
    num_row = 0;
  }
  if (num_column < 1) {
    num_column = 0;
  }
  this->num_row_ = num_row;
  this->num_column_ = num_column;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->data_,(ulong)(uint)(num_row * num_column));
  std::vector<double_*,_std::allocator<double_*>_>::resize(&this->index_,(long)this->num_row_);
  Fill(this,0.0);
  iVar1 = this->num_row_;
  iVar2 = this->num_column_;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] =
         (double *)
         ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar4);
    lVar4 = lVar4 + (long)iVar2 * 8;
  }
  return;
}

Assistant:

void Matrix::Resize(int num_row, int num_column) {
  num_row_ = num_row < 0 ? 0 : num_row;
  num_column_ = num_column < 0 ? 0 : num_column;
  data_.resize(num_row_ * num_column_);
  index_.resize(num_row_);

  Fill(0.0);
  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}